

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

Ea<(moira::Mode)10,_1> * __thiscall
moira::Moira::Op<(moira::Mode)10,1>
          (Ea<(moira::Mode)10,_1> *__return_storage_ptr__,Moira *this,u16 reg,u32 *pc)

{
  u32 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  u8 uVar5;
  ushort uVar6;
  u8 uVar7;
  
  __return_storage_ptr__->reg = reg;
  uVar1 = *pc;
  __return_storage_ptr__->pc = uVar1;
  *pc = uVar1 + 2;
  uVar2 = (*this->_vptr_Moira[6])();
  uVar4 = uVar2 & 0xffff;
  __return_storage_ptr__->ext1 = uVar4;
  __return_storage_ptr__->ext2 = 0;
  __return_storage_ptr__->ext3 = 0;
  if ((uVar4 >> 8 & 1) == 0) {
    return __return_storage_ptr__;
  }
  uVar6 = (ushort)(uVar4 >> 4) & 3;
  uVar5 = (uVar6 == 3) + '\x01';
  if (uVar6 < 2) {
    uVar5 = '\0';
  }
  __return_storage_ptr__->dw = uVar5;
  uVar6 = (ushort)uVar2 & 3;
  uVar7 = (uVar6 == 3) + '\x01';
  if (uVar6 < 2) {
    uVar7 = '\0';
  }
  if ((~uVar4 & 0x44) == 0 && (this->instrStyle).syntax == MUSASHI) {
    uVar7 = '\0';
  }
  __return_storage_ptr__->ow = uVar7;
  if (uVar5 == '\x02') {
    *pc = *pc + 2;
    iVar3 = (*this->_vptr_Moira[6])(this);
    *pc = *pc + 2;
    uVar2 = (*this->_vptr_Moira[6])(this);
    uVar2 = uVar2 & 0xffff | iVar3 << 0x10;
  }
  else {
    if (uVar5 != '\x01') goto LAB_002862f5;
    *pc = *pc + 2;
    iVar3 = (*this->_vptr_Moira[6])(this);
    uVar2 = (uint)(short)iVar3;
  }
  __return_storage_ptr__->ext2 = uVar2;
LAB_002862f5:
  if (uVar7 == '\x02') {
    *pc = *pc + 2;
    iVar3 = (*this->_vptr_Moira[6])(this);
    *pc = *pc + 2;
    uVar2 = (*this->_vptr_Moira[6])(this);
    uVar2 = uVar2 & 0xffff | iVar3 << 0x10;
  }
  else {
    if (uVar7 != '\x01') {
      return __return_storage_ptr__;
    }
    *pc = *pc + 2;
    iVar3 = (*this->_vptr_Moira[6])(this);
    uVar2 = (uint)(short)iVar3;
  }
  __return_storage_ptr__->ext3 = uVar2;
  return __return_storage_ptr__;
}

Assistant:

Ea<M,S>
Moira::Op(u16 reg, u32 &pc) const
{
    Ea<M,S> result;
    result.reg = reg;
    result.pc = pc;

    // Read extension words
    switch (M)
    {
        case Mode(5):  // (d,An)
        case Mode(7):  // ABS.W
        case Mode(9):  // (d,PC)
        {
            result.ext1 = dasmIncRead<Word>(pc);
            break;
        }
        case Mode(8):  // ABS.L
        {
            result.ext1 = dasmIncRead<Word>(pc);
            result.ext1 = result.ext1 << 16 | dasmIncRead<Word>(pc);
            break;
        }
        case Mode(6):  // (d,An,Xi)
        case Mode(10): // (d,PC,Xi)
        {
            result.ext1 = dasmIncRead<Word>(pc);
            result.ext2 = 0;
            result.ext3 = 0;

            if (result.ext1 & 0x100) {

                result.dw = u8(baseDispWords((u16)result.ext1));
                result.ow = u8(outerDispWords((u16)result.ext1));

                // Compensate Musashi bug (?)
                if (instrStyle.syntax == Syntax::MUSASHI && (result.ext1 & 0x47) >= 0x44) {

                    result.ow = 0;
                }

                if (result.dw == 1) result.ext2 = (i16)dasmIncRead<Word>(pc);
                if (result.dw == 2) result.ext2 = (i32)dasmIncRead<Long>(pc);
                if (result.ow == 1) result.ext3 = (i16)dasmIncRead<Word>(pc);
                if (result.ow == 2) result.ext3 = (i32)dasmIncRead<Long>(pc);
            }
            break;
        }
        case Mode(11): // Imm
        {
            result.ext1 = dasmIncRead<S>(pc);
            break;
        }
        default:
        {
            break;
        }
    }

    return result;
}